

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_value(jsonpr_ctx *pctx,ly_ctx *ctx,lyd_value *val,lys_module *param_4)

{
  char *text;
  char *local_58;
  char *value;
  LY_DATA_TYPE basetype;
  ly_bool dynamic;
  lys_module *local_mod_local;
  lyd_value *val_local;
  ly_ctx *ctx_local;
  jsonpr_ctx *pctx_local;
  
  _basetype = param_4;
  local_mod_local = (lys_module *)val;
  val_local = (lyd_value *)ctx;
  ctx_local = (ly_ctx *)pctx;
  text = (char *)(*val->realtype->plugin->print)
                           (ctx,val,LY_VALUE_JSON,param_4,(ly_bool *)((long)&value + 7),
                            (size_t *)0x0);
  if (text == (char *)0x0) {
    return LY_EINVAL;
  }
  value._0_4_ = *(undefined4 *)(local_mod_local->name + 0x18);
  do {
    switch(value._0_4_) {
    case 1:
    case 5:
    case 6:
    case 7:
    case 9:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x13:
      json_print_string((ly_out *)(ctx_local->dict).hash_tab,text);
LAB_0015cf80:
      if (value._7_1_ != '\0') {
        free(text);
      }
      return LY_SUCCESS;
    case 2:
    case 3:
    case 4:
    case 8:
    case 0x10:
    case 0x11:
    case 0x12:
      local_58 = text;
      if (*text == '\0') {
        local_58 = "null";
      }
      ly_print_((ly_out *)(ctx_local->dict).hash_tab,"%s",local_58);
      goto LAB_0015cf80;
    case 10:
      ly_print_((ly_out *)(ctx_local->dict).hash_tab,"[null]");
      goto LAB_0015cf80;
    default:
      ly_log((ly_ctx *)(ctx_local->dict).lock.__data.__list.__prev,LY_LLERR,LY_EINT,
             "Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
             ,0x18e);
      return LY_EINT;
    case 0xf:
      local_mod_local = (lys_module *)local_mod_local->revision;
      value._0_4_ = *(undefined4 *)(local_mod_local->name + 0x18);
    }
  } while( true );
}

Assistant:

static LY_ERR
json_print_value(struct jsonpr_ctx *pctx, const struct ly_ctx *ctx, const struct lyd_value *val,
        const struct lys_module *local_mod)
{
    ly_bool dynamic;
    LY_DATA_TYPE basetype;
    const char *value;

    value = val->realtype->plugin->print(ctx, val, LY_VALUE_JSON, (void *)local_mod, &dynamic, NULL);
    LY_CHECK_RET(!value, LY_EINVAL);
    basetype = val->realtype->basetype;

print_val:
    /* leafref is not supported */
    switch (basetype) {
    case LY_TYPE_UNION:
        /* use the resolved type */
        val = &val->subvalue->value;
        basetype = val->realtype->basetype;
        goto print_val;

    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM:
    case LY_TYPE_INST:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
    case LY_TYPE_DEC64:
    case LY_TYPE_IDENT:
        json_print_string(pctx->out, value);
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_BOOL:
        ly_print_(pctx->out, "%s", value[0] ? value : "null");
        break;

    case LY_TYPE_EMPTY:
        ly_print_(pctx->out, "[null]");
        break;

    default:
        /* error */
        LOGINT_RET(pctx->ctx);
    }

    if (dynamic) {
        free((char *)value);
    }

    return LY_SUCCESS;
}